

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

string * __thiscall
cmFortranParser_s::SModName
          (string *__return_storage_ptr__,cmFortranParser_s *this,string *mod_name,string *sub_name)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = (this->Compiler).SModExt._M_string_length;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,".mod","");
  }
  else {
    pcVar2 = (this->Compiler).SModExt._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,pcVar2,pcVar2 + sVar1);
  }
  if ((this->Compiler).SModSep._M_string_length == 0) {
    std::operator+(__return_storage_ptr__,sub_name,&local_80);
  }
  else {
    std::operator+(&local_40,mod_name,&(this->Compiler).SModSep);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_40,(ulong)(sub_name->_M_dataplus)._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_50 = *plVar5;
      lStack_48 = plVar4[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar5;
      local_60 = (long *)*plVar4;
    }
    local_58 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFortranParser_s::SModName(std::string const& mod_name,
                                        std::string const& sub_name) const
{
  std::string const& SModExt =
    this->Compiler.SModExt.empty() ? ".mod" : this->Compiler.SModExt;
  // An empty separator means that the compiler does not use a prefix.
  if (this->Compiler.SModSep.empty()) {
    return sub_name + SModExt;
  }
  return mod_name + this->Compiler.SModSep + sub_name + SModExt;
}